

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AStateProvider_A_FireProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double z;
  double dVar2;
  double dVar3;
  AActor *source;
  undefined8 *puVar4;
  void *pvVar5;
  PClassActor *type;
  AWeapon *this;
  PClass *pPVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  PClass *pPVar9;
  AActor *this_00;
  VMValue *pVVar10;
  uint uVar11;
  PClassActor *pPVar12;
  VMValue *pVVar13;
  TArray<VMValue,_VMValue> *pTVar14;
  char *pcVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  DAngle local_58;
  FTranslatedLineTarget t;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003ccb67:
      pcVar15 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003ccbaa;
    }
    source = (AActor *)(param->field_0).field_1.a;
    pTVar14 = defaultparam;
    uVar11 = numparam;
    if (source != (AActor *)0x0) {
      if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
        (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
      }
      pPVar9 = (source->super_DThinker).super_DObject.Class;
      bVar16 = pPVar9 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar16;
      uVar11 = (uint)bVar16;
      pTVar14 = (TArray<VMValue,_VMValue> *)(ulong)(pPVar9 == pPVar6 || bVar16);
      if (pPVar9 != pPVar6 && !bVar16) {
        do {
          pPVar9 = pPVar9->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar9 != (PClass *)0x0);
          if (pPVar9 == pPVar6) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003ccbaa;
      }
    }
    pPVar6 = AStateProvider::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003ccb67;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar8 = (**(code **)*puVar4)(puVar4,pTVar14,uVar11,ret);
          puVar4[1] = uVar8;
        }
        pPVar9 = (PClass *)puVar4[1];
        bVar16 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar6 && bVar16) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar16 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar16) {
          pcVar15 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
          goto LAB_003ccbaa;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar15 = "(paramnum) < numparam";
          }
          else {
            if ((param[3].field_0.field_3.Type == '\x03') &&
               ((pvVar5 = param[2].field_0.field_1.a, param[3].field_0.field_1.atag == 1 ||
                (param[3].field_0.field_1.a == (void *)0x0)))) {
              type = (PClassActor *)param[3].field_0.field_1.a;
              if ((type != (PClassActor *)0x0) &&
                 (pPVar12 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                do {
                  pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
                  if (pPVar12 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
                } while (pPVar12 != (PClassActor *)0x0);
                if (pPVar12 == (PClassActor *)0x0) {
                  pcVar15 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
                  goto LAB_003ccc83;
                }
              }
              if (numparam < 5) {
                pVVar10 = defaultparam->Array;
                if (pVVar10[4].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003ccbc9;
                }
              }
              else {
                pVVar10 = param;
                if (param[4].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ccbc9:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x7cb,
                                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              dVar19 = pVVar10[4].field_0.f;
              if (numparam < 6) {
                pVVar10 = defaultparam->Array;
                if (pVVar10[5].field_0.field_3.Type != '\0') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003ccbe8;
                }
              }
              else {
                pVVar10 = param;
                if (param[5].field_0.field_3.Type != '\0') {
                  pcVar15 = "(param[paramnum]).Type == REGT_INT";
LAB_003ccbe8:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x7cc,
                                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              if (numparam < 7) {
                pVVar13 = defaultparam->Array;
                if (pVVar13[6].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003ccc07;
                }
              }
              else {
                pVVar13 = param;
                if (param[6].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ccc07:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x7cd,
                                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              dVar1 = pVVar13[6].field_0.f;
              if (numparam < 8) {
                pVVar13 = defaultparam->Array;
                if (pVVar13[7].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003ccc26;
                }
              }
              else {
                pVVar13 = param;
                if (param[7].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ccc26:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x7ce,
                                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              z = pVVar13[7].field_0.f;
              if (numparam < 9) {
                pVVar13 = defaultparam->Array;
                if (pVVar13[8].field_0.field_3.Type != '\0') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003ccc45;
                }
              }
              else {
                pVVar13 = param;
                if (param[8].field_0.field_3.Type != '\0') {
                  pcVar15 = "(param[paramnum]).Type == REGT_INT";
LAB_003ccc45:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,1999,
                                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              uVar11 = pVVar13[8].field_0.i;
              if (numparam < 10) {
                param = defaultparam->Array;
                if (param[9].field_0.field_3.Type != '\x01') {
                  pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003ccc64;
                }
              }
              else if (param[9].field_0.field_3.Type != '\x01') {
                pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ccc64:
                __assert_fail(pcVar15,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,2000,
                              "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (source->player != (player_t *)0x0) {
                dVar2 = param[9].field_0.f;
                if (((pvVar5 == (void *)0x0 || pVVar10[5].field_0.i == 0) ||
                    (*(int *)((long)pvVar5 + 8) != 1)) ||
                   (this = source->player->ReadyWeapon, this == (AWeapon *)0x0)) {
                  if (type == (PClassActor *)0x0) {
                    return 0;
                  }
                }
                else {
                  bVar16 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
                  if (type == (PClassActor *)0x0) {
                    return 0;
                  }
                  if (!bVar16) {
                    return 0;
                  }
                }
                dVar17 = FFastTrig::cos(&fasttrig,
                                        ((source->Angles).Yaw.Degrees + -90.0) * 11930464.711111112
                                        + 6755399441055744.0);
                dVar17 = dVar17 * dVar1;
                dVar18 = FFastTrig::sin(&fasttrig,dVar17);
                dVar3 = (source->Angles).Pitch.Degrees;
                local_58.Degrees = (source->Angles).Yaw.Degrees;
                if ((uVar11 & 1) != 0) {
                  local_58.Degrees = local_58.Degrees + dVar19;
                }
                (source->Angles).Pitch.Degrees = dVar3 - dVar2;
                this_00 = P_SpawnPlayerMissile
                                    (source,dVar17,dVar18 * dVar1,z,type,&local_58,&t,(AActor **)0x0
                                     ,false,SUB41((uVar11 & 4) >> 2,0),0);
                (source->Angles).Pitch.Degrees = dVar3;
                if (this_00 != (AActor *)0x0) {
                  if ((uVar11 & 2) != 0) {
                    this_00->Translation = source->Translation;
                  }
                  if (((t.linetarget != (AActor *)0x0) && (t.unlinked == false)) &&
                     (((this_00->flags2).Value & 0x40000000) != 0)) {
                    (this_00->tracer).field_0.p = t.linetarget;
                  }
                  if ((uVar11 & 1) == 0) {
                    (this_00->Angles).Yaw.Degrees = dVar19 + (this_00->Angles).Yaw.Degrees;
                    dVar19 = (this_00->Vel).X;
                    dVar1 = (this_00->Vel).Y;
                    dVar19 = c_sqrt(dVar1 * dVar1 + dVar19 * dVar19);
                    AActor::VelFromAngle(this_00,dVar19);
                  }
                }
              }
              return 0;
            }
            pcVar15 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_003ccc83:
          __assert_fail(pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x7ca,
                        "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar15 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003ccbaa;
      }
    }
  }
  pcVar15 = "(paramnum) < numparam";
LAB_003ccbaa:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x7c9,
                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireProjectile)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_CLASS		(ti, AActor);
	PARAM_ANGLE_DEF	(angle);
	PARAM_BOOL_DEF	(useammo);
	PARAM_FLOAT_DEF	(spawnofs_xy);
	PARAM_FLOAT_DEF	(spawnheight);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(pitch);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;
	FTranslatedLineTarget t;

		// Only use ammo if called from a weapon
	if (useammo && ACTION_CALL_FROM_PSPRITE() && weapon)
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (ti) 
	{
		DAngle ang = self->Angles.Yaw - 90;
		DVector2 ofs = ang.ToVector(spawnofs_xy);
		DAngle shootangle = self->Angles.Yaw;

		if (flags & FPF_AIMATANGLE) shootangle += angle;

		// Temporarily adjusts the pitch
		DAngle saved_player_pitch = self->Angles.Pitch;
		self->Angles.Pitch -= pitch;
		AActor * misl=P_SpawnPlayerMissile (self, ofs.X, ofs.Y, spawnheight, ti, shootangle, &t, NULL, false, (flags & FPF_NOAUTOAIM) != 0);
		self->Angles.Pitch = saved_player_pitch;

		// automatic handling of seeker missiles
		if (misl)
		{
			if (flags & FPF_TRANSFERTRANSLATION)
				misl->Translation = self->Translation;
			if (t.linetarget && !t.unlinked && (misl->flags2 & MF2_SEEKERMISSILE))
				misl->tracer = t.linetarget;
			if (!(flags & FPF_AIMATANGLE))
			{
				// This original implementation is to aim straight ahead and then offset
				// the angle from the resulting direction. 
				misl->Angles.Yaw += angle;
				misl->VelFromAngle(misl->VelXYToSpeed());
			}
		}
	}
	return 0;
}